

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

int __thiscall
CorUnix::CPalSynchronizationManager::ReadBytesFromProcessPipe
          (CPalSynchronizationManager *this,int iTimeout,BYTE *pRecvBuf,LONG iBytes)

{
  FILE *__stream;
  BOOL BVar1;
  uint *puVar2;
  char *pcVar3;
  ssize_t sVar4;
  int *piVar5;
  int local_64;
  uint local_44;
  BYTE *pBStack_40;
  int iErrno;
  BYTE *pPos;
  LONG iBytesRead;
  int iConsecutiveEintrs;
  int iRet;
  pollfd Poll;
  LONG iBytes_local;
  BYTE *pRecvBuf_local;
  int iTimeout_local;
  CPalSynchronizationManager *this_local;
  
  pPos._4_4_ = 0;
  pPos._0_4_ = 0;
  Poll.fd = iBytes;
  unique0x1000029a = pRecvBuf;
  pBStack_40 = pRecvBuf;
  if (iBytes < 0) {
    fprintf(_stderr,"] %s %s:%d","ReadBytesFromProcessPipe",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0x75b);
    fprintf(_stderr,"Expression: 0 <= iBytes\n");
  }
LAB_00160ccc:
  do {
    local_44 = 0;
    iConsecutiveEintrs = this->m_iProcessPipeRead;
    iRet._0_2_ = 1;
    iRet._2_2_ = 0;
    iBytesRead = poll((pollfd *)&iConsecutiveEintrs,1,iTimeout);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    if ((iBytesRead == 1) && ((iRet._2_2_ & 0x38) != 0)) {
      BVar1 = PALIsShuttingDown();
      if ((BVar1 == 0) || (iRet._2_2_ != 0x10)) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        local_44 = 0x16;
        iBytesRead = -1;
      }
    }
    else if (iBytesRead < 0) {
      puVar2 = (uint *)__errno_location();
      local_44 = *puVar2;
    }
    if ((iBytesRead != 0) && (iBytesRead != 1)) {
      if (1 < iBytesRead) {
        fprintf(_stderr,"] %s %s:%d","ReadBytesFromProcessPipe",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x7ef);
        fprintf(_stderr,"Unexpected return code %d from blocking poll/kevent call\n",
                (ulong)(uint)iBytesRead);
        goto LAB_00160f5d;
      }
      if (local_44 != 4) {
        fprintf(_stderr,"] %s %s:%d","ReadBytesFromProcessPipe",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
                ,0x7f7);
        __stream = _stderr;
        pcVar3 = strerror(local_44);
        fprintf(__stream,"Unexpected error from blocking poll/kevent call: %d (%s)\n",
                (ulong)local_44,pcVar3);
        goto LAB_00160f5d;
      }
      pPos._4_4_ = pPos._4_4_ + 1;
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      if (pPos._4_4_ < 0x80) goto LAB_00160ccc;
      if (iTimeout == -1) {
        if ((pPos._4_4_ % 0x80 == 0) && ((PAL_InitializeChakraCoreCalled & 1U) == 0)) {
          abort();
        }
        goto LAB_00160ccc;
      }
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      iBytesRead = 0;
    }
    if (iBytesRead == 0) goto LAB_00160f5d;
    sVar4 = read(this->m_iProcessPipeRead,pBStack_40,(long)(Poll.fd - (int)pPos));
    iBytesRead = (LONG)sVar4;
    if (iBytesRead == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      goto LAB_00160f5d;
    }
    if (iBytesRead < 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar5 = __errno_location();
      strerror(*piVar5);
      goto LAB_00160f5d;
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    pPos._0_4_ = iBytesRead + (int)pPos;
    pBStack_40 = pBStack_40 + iBytesRead;
    if (Poll.fd <= (int)pPos) {
LAB_00160f5d:
      if (iBytesRead < 0) {
        local_64 = iBytesRead;
      }
      else {
        local_64 = (int)pPos;
      }
      return local_64;
    }
  } while( true );
}

Assistant:

int CPalSynchronizationManager::ReadBytesFromProcessPipe(
        int iTimeout,
        BYTE * pRecvBuf,
        LONG iBytes)
    {
#if !HAVE_KQUEUE
        struct pollfd Poll;
#endif // !HAVE_KQUEUE
        int iRet = -1;
        int iConsecutiveEintrs = 0;
        LONG iBytesRead = 0;
        BYTE * pPos = pRecvBuf;
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
        struct kevent keChanges;
        struct timespec ts, *pts;
        int iNChanges;
#endif // HAVE_KQUEUE

        _ASSERTE(0 <= iBytes);

        do
        {
            while (TRUE)
            {
                int iErrno = 0;
#if HAVE_KQUEUE
#if HAVE_BROKEN_FIFO_KEVENT
#if HAVE_BROKEN_FIFO_SELECT
#error Found no way to wait on a FIFO.
#endif

                timeval *ptv;
                timeval tv;

                if (INFTIM == iTimeout)
                {
                    ptv = NULL;
                }
                else
                {
                    tv.tv_usec = (iTimeout % tccSecondsToMillieSeconds) *
                        tccMillieSecondsToMicroSeconds;
                    tv.tv_sec = iTimeout / tccSecondsToMillieSeconds;
                    ptv = &tv;
                }

                fd_set readfds;
                FD_ZERO(&readfds);
                FD_SET(m_iProcessPipeRead, &readfds);
                iRet = select(m_iProcessPipeRead + 1, &readfds, NULL, NULL, ptv);

#else // HAVE_BROKEN_FIFO_KEVENT

                // Note: FreeBSD needs to use kqueue/kevent support here, since on this
                // platform the EOF notification on FIFOs is not surfaced through poll,
                // and process pipe shutdown relies on this feature.
                // If a thread is polling a FIFO or a pipe for POLLIN, when the last
                // write descriptor for that pipe is closed, poll() is supposed to
                // return with a POLLIN event but no data to be read on the FIFO/pipe,
                // which means EOF.
                // On FreeBSD such feature works for pipes but it doesn't for FIFOs.
                // Using kevent the EOF is instead surfaced correctly.

                if (iBytes > m_keProcessPipeEvent.data)
                {
                    if (INFTIM == iTimeout)
                    {
                        pts = NULL;
                    }
                    else
                    {
                        ts.tv_nsec = (iTimeout % tccSecondsToMillieSeconds) *
                            tccMillieSecondsToNanoSeconds;
                        ts.tv_sec = iTimeout / tccSecondsToMillieSeconds;
                        pts = &ts;
                    }

                    if (0 != (EV_EOF & m_keProcessPipeEvent.flags))
                    {
                        TRACE("Refreshing kevent settings\n");
                        EV_SET(&keChanges, m_iProcessPipeRead, EVFILT_READ,
                               EV_ADD | EV_CLEAR, 0, 0, 0);
                        iNChanges = 1;
                    }
                    else
                    {
                        iNChanges = 0;
                    }

                    iRet = kevent(m_iKQueue, &keChanges, iNChanges,
                                  &m_keProcessPipeEvent, 1, pts);

                    if (0 < iRet)
                    {
                        _ASSERTE(1 == iRet);
                        _ASSERTE(EVFILT_READ == m_keProcessPipeEvent.filter);

                        if (EV_ERROR & m_keProcessPipeEvent.flags)
                        {
                            ERROR("EV_ERROR from kevent [ident=%d filter=%d flags=%x]\n", m_keProcessPipeEvent.ident, m_keProcessPipeEvent.filter, m_keProcessPipeEvent.flags);
                            iRet = -1;
                            iErrno = m_keProcessPipeEvent.data;
                            m_keProcessPipeEvent.data = 0;
                        }
                    }
                    else if (0 > iRet)
                    {
                        iErrno = errno;
                    }

                    TRACE("Woken up from kevent() with ret=%d flags=%#x data=%d "
                          "[iTimeout=%d]\n", iRet, m_keProcessPipeEvent.flags,
                          m_keProcessPipeEvent.data, iTimeout);
                }
                else
                {
                    // There is enough data already available in the buffer,
                    // just use that.
                    iRet = 1;
                }

#endif // HAVE_BROKEN_FIFO_KEVENT
#else // HAVE_KQUEUE

                Poll.fd = m_iProcessPipeRead;
                Poll.events = POLLIN;
                Poll.revents = 0;

                iRet = poll(&Poll, 1, iTimeout);

                TRACE("Woken up from poll() with ret=%d [iTimeout=%d]\n",
                       iRet, iTimeout);

                if (1 == iRet &&
                    ((POLLERR | POLLHUP | POLLNVAL) & Poll.revents))
                {
                    // During PAL shutdown the pipe gets closed and Poll.revents is set to POLLHUP
                    // (note: no other flags are set). We will also receive an EOF on from the read call.
                    // Please see the comment for SynchWorkerCmdShutdown in CPalSynchronizationManager::WorkerThread.
                    if (!PALIsShuttingDown() || (Poll.revents != POLLHUP))
                    {
                        ERROR("Unexpected revents=%x while polling pipe %d\n",
                            Poll.revents, Poll.fd);
                        iErrno = EINVAL;
                        iRet = -1;
                    }
                }
                else if (0 > iRet)
                {
                    iErrno = errno;
                }

#endif // HAVE_KQUEUE

                if (0 == iRet || 1 == iRet)
                {
                    // 0 == wait timed out
                    // 1 == FIFO has data available
                    break;
                }
                else
                {
                    if (1 < iRet)
                    {
                        // Unexpected iRet > 1
                        ASSERT("Unexpected return code %d from blocking poll/kevent call\n",
                                iRet);
                        goto RBFPP_exit;
                    }

                    if (EINTR != iErrno)
                    {
                        // Unexpected error
                        ASSERT("Unexpected error from blocking poll/kevent call: %d (%s)\n",
                               iErrno, strerror(iErrno));
                        goto RBFPP_exit;
                    }

                    iConsecutiveEintrs++;
                    TRACE("poll() failed with EINTR; re-polling\n");

                    if (iConsecutiveEintrs >= MaxWorkerConsecutiveEintrs)
                    {
                        if (iTimeout != INFTIM)
                        {
                            WARN("Receiving too many EINTRs; converting one of them "
                                 "to a timeout");
                            iRet = 0;
                            break;
                        }
                        else if (0 == (iConsecutiveEintrs % MaxWorkerConsecutiveEintrs))
                        {
                            WARN("Receiving too many EINTRs [%d so far]",
                                 iConsecutiveEintrs);
                        }
                    }
                }
            }

            if (0 == iRet)
            {
                // Time out
                break;
            }
            else
            {
#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
                if (0 != (EV_EOF & m_keProcessPipeEvent.flags) && 0 == m_keProcessPipeEvent.data)
                {
                    // EOF
                    TRACE("Received an EOF on process pipe via kevent\n");
                    goto RBFPP_exit;
                }
#endif // HAVE_KQUEUE

                iRet = read(m_iProcessPipeRead, pPos, iBytes - iBytesRead);

                if (0 == iRet)
                {
                    // Poll returned 1 and read returned zero: this is an EOF,
                    // i.e. no other process has the pipe still open for write
                    TRACE("Received an EOF on process pipe via poll\n");
                    goto RBFPP_exit;
                }
                else if (0 > iRet)
                {
                    ERROR("Unable to read %d bytes from the the process pipe "
                          "[pipe=%d ret=%d errno=%d (%s)]\n", iBytes - iBytesRead,
                          m_iProcessPipeRead, iRet, errno, strerror(errno));
                    goto RBFPP_exit;
                }

                TRACE("Read %d bytes from process pipe\n", iRet);

                iBytesRead += iRet;
                pPos += iRet;

#if HAVE_KQUEUE && !HAVE_BROKEN_FIFO_KEVENT
                // Update available data count
                m_keProcessPipeEvent.data -= iRet;
                _ASSERTE(0 <= m_keProcessPipeEvent.data);
#endif // HAVE_KQUEUE
            }
        } while(iBytesRead < iBytes);

    RBFPP_exit:
        return (iRet < 0) ? iRet : iBytesRead;
    }